

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

void __thiscall
efsw::DirWatcherGeneric::moveDirectory(DirWatcherGeneric *this,string *oldDir,string *newDir)

{
  iterator iVar1;
  iterator this_00;
  bool bVar2;
  pointer ppVar3;
  mapped_type *ppDVar4;
  string local_f0 [32];
  _Self local_d0;
  _Base_ptr local_c8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
  local_c0;
  iterator dit;
  DirWatcherGeneric *dw;
  FileSystem local_90 [48];
  string local_60 [32];
  FileSystem local_40 [32];
  string *local_20;
  string *newDir_local;
  string *oldDir_local;
  DirWatcherGeneric *this_local;
  
  local_20 = newDir;
  newDir_local = oldDir;
  oldDir_local = (string *)this;
  FileSystem::dirRemoveSlashAtEnd(oldDir);
  std::__cxx11::string::string(local_60,(string *)oldDir);
  FileSystem::fileNameFromPath(local_40,(string *)local_60);
  std::__cxx11::string::operator=((string *)oldDir,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string(local_60);
  FileSystem::dirRemoveSlashAtEnd(newDir);
  std::__cxx11::string::string((string *)&dw,(string *)newDir);
  FileSystem::fileNameFromPath(local_90,(string *)&dw);
  std::__cxx11::string::operator=((string *)newDir,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&dw);
  dit._M_node = (_Base_ptr)0x0;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
  ::_Rb_tree_iterator(&local_c0);
  local_c8 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
             ::find(&this->Directories,oldDir);
  local_c0._M_node = local_c8;
  local_d0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
       ::end(&this->Directories);
  bVar2 = std::operator!=(&local_c0,&local_d0);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
             ::operator->(&local_c0);
    dit._M_node = (_Base_ptr)ppVar3->second;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
             ::operator->(&local_c0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
    ::erase(&this->Directories,&ppVar3->first);
    iVar1 = dit;
    ppDVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
              ::operator[](&this->Directories,newDir);
    this_00 = dit;
    *ppDVar4 = (mapped_type)iVar1._M_node;
    std::__cxx11::string::string(local_f0,(string *)newDir);
    resetDirectory((DirWatcherGeneric *)this_00._M_node,(string *)local_f0);
    std::__cxx11::string::~string(local_f0);
  }
  return;
}

Assistant:

void DirWatcherGeneric::moveDirectory( std::string oldDir, std::string newDir ) {
	FileSystem::dirRemoveSlashAtEnd( oldDir );
	oldDir = FileSystem::fileNameFromPath( oldDir );

	FileSystem::dirRemoveSlashAtEnd( newDir );
	newDir = FileSystem::fileNameFromPath( newDir );

	DirWatcherGeneric* dw = NULL;
	DirWatchMap::iterator dit;

	/// Directory existed?
	dit = Directories.find( oldDir );

	if ( dit != Directories.end() ) {
		dw = dit->second;

		/// Remove the directory from the map
		Directories.erase( dit->first );

		Directories[newDir] = dw;

		dw->resetDirectory( newDir );
	}
}